

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O1

int32_t __thiscall
icu_63::DayPeriodRules::getEndHourForDayPeriod
          (DayPeriodRules *this,DayPeriod dayPeriod,UErrorCode *errorCode)

{
  ulong uVar1;
  long lVar2;
  int32_t iVar3;
  ulong uVar4;
  bool bVar5;
  
  if (U_ZERO_ERROR < *errorCode) {
    return -1;
  }
  if (dayPeriod == DAYPERIOD_MIDNIGHT) {
    return 0;
  }
  if (dayPeriod == DAYPERIOD_NOON) {
    return 0xc;
  }
  if ((this->fDayPeriodForHour[0] == dayPeriod) && (this->fDayPeriodForHour[0x17] == dayPeriod)) {
    if (this->fDayPeriodForHour[1] == dayPeriod) {
      uVar4 = 0;
      do {
        if (uVar4 == 0x15) goto LAB_002cf765;
        uVar1 = uVar4 + 1;
        lVar2 = uVar4 + 2;
        uVar4 = uVar1;
      } while (this->fDayPeriodForHour[lVar2] == dayPeriod);
      bVar5 = 0x15 < uVar1;
      iVar3 = (int)uVar1 + 1;
      goto LAB_002cf761;
    }
    iVar3 = 1;
  }
  else {
    if (this->fDayPeriodForHour[0x17] != dayPeriod) {
      uVar4 = 0x17;
      do {
        iVar3 = (int32_t)uVar4;
        bVar5 = iVar3 == 0;
        if (bVar5) break;
        uVar4 = (ulong)(iVar3 - 1);
      } while (this->fDayPeriodForHour[uVar4] != dayPeriod);
      goto LAB_002cf761;
    }
    iVar3 = 0x18;
  }
  bVar5 = false;
LAB_002cf761:
  if (!bVar5) {
    return iVar3;
  }
LAB_002cf765:
  *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return -1;
}

Assistant:

int32_t DayPeriodRules::getEndHourForDayPeriod(
        DayPeriodRules::DayPeriod dayPeriod, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) { return -1; }

    if (dayPeriod == DAYPERIOD_MIDNIGHT) { return 0; }
    if (dayPeriod == DAYPERIOD_NOON) { return 12; }

    if (fDayPeriodForHour[0] == dayPeriod && fDayPeriodForHour[23] == dayPeriod) {
        // dayPeriod wraps around midnight. End hour is before start hour.
        for (int32_t i = 1; i <= 22; ++i) {
            if (fDayPeriodForHour[i] != dayPeriod) {
                // i o'clock is when a new period starts, therefore when the old period ends.
                return i;
            }
        }
    } else {
        for (int32_t i = 23; i >= 0; --i) {
            if (fDayPeriodForHour[i] == dayPeriod) {
                return (i + 1);
            }
        }
    }

    // dayPeriod doesn't exist in rule set; set error and exit.
    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}